

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_neg_16_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint res;
  uint src;
  uint ea;
  
  uVar2 = m68ki_read_imm_16();
  uVar3 = m68ki_read_16_fc((int)(short)uVar2,m68ki_cpu.s_flag | m68ki_address_space);
  uVar1 = -uVar3;
  m68ki_cpu.n_flag = uVar1 >> 8;
  m68ki_cpu.x_flag = uVar1 >> 8;
  m68ki_cpu.v_flag = (uVar3 & uVar1) >> 8;
  m68ki_cpu.not_z_flag = uVar1 & 0xffff;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_16_fc((int)(short)uVar2,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_neg_16_aw(void)
{
	uint ea = EA_AW_16();
	uint src = m68ki_read_16(ea);
	uint res = 0 - src;

	FLAG_N = NFLAG_16(res);
	FLAG_C = FLAG_X = CFLAG_16(res);
	FLAG_V = (src & res)>>8;
	FLAG_Z = MASK_OUT_ABOVE_16(res);

	m68ki_write_16(ea, FLAG_Z);
}